

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O2

void vkt::texture::anon_unknown_0::populateTextureMipmappingTests
               (TestCaseGroup *textureMipmappingTests)

{
  vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *this;
  TestContext *testCtx;
  char *pcVar1;
  char *pcVar2;
  TestCaseGroup *pTVar3;
  anon_struct_16_2_3f8b7511_conflict *paVar4;
  ostream *poVar5;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance> *pTVar6;
  long lVar7;
  TestNode *pTVar8;
  long lVar9;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance> *pTVar10;
  anon_struct_16_2_3f8b7511_conflict *paVar11;
  long lVar12;
  allocator<char> local_321;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group2D;
  allocator<char> local_309;
  Texture2DMipmapTestCaseParameters testParameters;
  string local_2a8;
  anon_struct_16_2_3f8b7511_conflict *local_288;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> maxLevelGroup2D;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> baseLevelGroup2D;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> maxLodGroup2D;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> minLodGroup2D;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> biasGroup2D;
  char *local_230 [4];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> coordTypeGroup;
  string local_200;
  anon_struct_16_2_3f8b7511_conflict *local_1e0;
  long local_1d8;
  long local_1d0;
  anon_struct_16_2_3f8b7511_conflict *local_1c8;
  long local_1c0;
  TestNode *local_1b8;
  CoordType local_1ac;
  ostringstream name;
  _Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> local_188;
  undefined8 local_170;
  TextureMipmapCommonTestCaseParameters TStack_168;
  char *local_158;
  
  testCtx = (textureMipmappingTests->super_TestNode).m_testCtx;
  local_1b8 = &textureMipmappingTests->super_TestNode;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"2d","2D Mipmap Filtering");
  group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar3;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"bias","User-supplied bias value");
  biasGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar3;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"min_lod","Lod control: min lod");
  minLodGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = pTVar3;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"max_lod","Lod control: max lod");
  maxLodGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = pTVar3;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"base_level","Base level");
  baseLevelGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar3;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"max_level","Max level");
  lVar7 = 0;
  maxLevelGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar3;
  while (lVar7 != 3) {
    pTVar3 = (TestCaseGroup *)operator_new(0x70);
    local_1c0 = lVar7;
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar3,testCtx,populateTextureMipmappingTests::coordTypes[lVar7].name,
               populateTextureMipmappingTests::coordTypes[lVar7].desc);
    local_1d0 = CONCAT44(local_1d0._4_4_,populateTextureMipmappingTests::coordTypes[lVar7].type);
    local_1c8 = (anon_struct_16_2_3f8b7511_conflict *)
                ((ulong)(populateTextureMipmappingTests::coordTypes[lVar7].type == COORDTYPE_BASIC)
                 << 5 | 0x10);
    paVar4 = (anon_struct_16_2_3f8b7511_conflict *)0x0;
    coordTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = pTVar3;
    while (pTVar3 = coordTypeGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.ptr, paVar4 != (anon_struct_16_2_3f8b7511_conflict *)0x4) {
      lVar7 = 0;
      local_1e0 = paVar4;
      while (lVar7 != 3) {
        local_288 = (anon_struct_16_2_3f8b7511_conflict *)
                    (populateTextureMipmappingTests::wrapModes + lVar7);
        local_1d8 = lVar7;
        for (paVar11 = (anon_struct_16_2_3f8b7511_conflict *)0x0; local_1c8 != paVar11;
            paVar11 = paVar11 + 1) {
          Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters(&testParameters);
          testParameters.super_TextureMipmapCommonTestCaseParameters.coordType =
               (CoordType)local_1d0;
          testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
          minFilter = populateTextureMipmappingTests::minFilterModes[(long)paVar4].mode;
          testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
          wrapT = local_288->mode;
          testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
          wrapS = local_288->mode;
          testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
          format = VK_FORMAT_R8G8B8A8_UNORM;
          testParameters.super_Texture2DTestCaseParameters.width = paVar11[0xc0ba7].mode;
          testParameters.super_Texture2DTestCaseParameters.height =
               *(int *)&paVar11[0xc0ba7].field_0xc;
          _name = 0;
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          emplace_back<vkt::texture::util::Program>
                    (&testParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.programs,(Program *)&name);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
          poVar5 = std::operator<<((ostream *)&name,
                                   populateTextureMipmappingTests::minFilterModes[(long)paVar4].name
                                  );
          poVar5 = std::operator<<(poVar5,"_");
          std::operator<<(poVar5,local_288->name);
          pcVar1 = paVar11[0xc0ba7].name;
          if (pcVar1 != (char *)0x0) {
            poVar5 = std::operator<<((ostream *)&name,"_");
            std::operator<<(poVar5,pcVar1);
          }
          pTVar3 = coordTypeGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr;
          pTVar6 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>
                    *)operator_new(0xc0);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a8,local_230[0],&local_321);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"",&local_309);
          util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>::
          TextureTestCase(pTVar6,testCtx,&local_2a8,&local_200,&testParameters);
          tcu::TestNode::addChild(&pTVar3->super_TestNode,(TestNode *)pTVar6);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)local_230);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
          std::
          _Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          ~_Vector_base(&testParameters.super_Texture2DTestCaseParameters.
                         super_TextureCommonTestCaseParameters.programs.
                         super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                       );
        }
        lVar7 = local_1d8 + 1;
      }
      paVar4 = (anon_struct_16_2_3f8b7511_conflict *)((long)&local_1e0->name + 1);
    }
    coordTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(group2D.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&coordTypeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    lVar7 = local_1c0 + 1;
  }
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 0x10) {
    Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters(&testParameters);
    testParameters.super_TextureMipmapCommonTestCaseParameters.coordType = COORDTYPE_BASIC_BIAS;
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.minFilter
         = *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar7);
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters._16_8_ =
         &DAT_200000002;
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.format =
         VK_FORMAT_R8G8B8A8_UNORM;
    testParameters.super_Texture2DTestCaseParameters.width = 0x40;
    testParameters.super_Texture2DTestCaseParameters.height = 0x40;
    _name = VK_SAMPLE_COUNT_4_BIT;
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.magFilter
         = testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
           minFilter;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    emplace_back<vkt::texture::util::Program>
              (&testParameters.super_Texture2DTestCaseParameters.
                super_TextureCommonTestCaseParameters.programs,(Program *)&name);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    std::operator<<((ostream *)&name,
                    *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar7
                              ));
    pTVar3 = biasGroup2D.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar6 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance> *)
             operator_new(0xc0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,local_230[0],(allocator<char> *)&coordTypeGroup);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"",&local_321);
    util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>::
    TextureTestCase(pTVar6,testCtx,&local_2a8,&local_200,&testParameters);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,(TestNode *)pTVar6);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)local_230);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
    std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    ~_Vector_base(&testParameters.super_Texture2DTestCaseParameters.
                   super_TextureCommonTestCaseParameters.programs.
                   super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                 );
  }
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 0x10) {
    Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)&name);
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = 0;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    emplace_back<vkt::texture::util::Program>
              ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &local_188,(Program *)&testParameters);
    pTVar3 = minLodGroup2D.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar8 = (TestNode *)operator_new(0xc0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testParameters,
               *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar7),
               (allocator<char> *)local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"",(allocator<char> *)&local_200);
    TestCase::TestCase((TestCase *)pTVar8,testCtx,(string *)&testParameters,&local_2a8);
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00c0bbc8;
    Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)(pTVar8 + 1),
               (Texture2DMipmapTestCaseParameters *)&name);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,pTVar8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&testParameters);
    std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    ~_Vector_base(&local_188);
  }
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 0x10) {
    Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)&name);
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = 0;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    emplace_back<vkt::texture::util::Program>
              ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &local_188,(Program *)&testParameters);
    pTVar3 = maxLodGroup2D.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar8 = (TestNode *)operator_new(0xc0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testParameters,
               *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar7),
               (allocator<char> *)local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"",(allocator<char> *)&local_200);
    TestCase::TestCase((TestCase *)pTVar8,testCtx,(string *)&testParameters,&local_2a8);
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00c0bcb8;
    Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)(pTVar8 + 1),
               (Texture2DMipmapTestCaseParameters *)&name);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,pTVar8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&testParameters);
    std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    ~_Vector_base(&local_188);
  }
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 0x10) {
    Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)&name);
    pcVar1 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar7);
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = 0;
    TStack_168.minFilterName = pcVar1;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    emplace_back<vkt::texture::util::Program>
              ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &local_188,(Program *)&testParameters);
    pTVar3 = baseLevelGroup2D.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar8 = (TestNode *)operator_new(0xc0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testParameters,pcVar1,(allocator<char> *)local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"",(allocator<char> *)&local_200);
    TestCase::TestCase((TestCase *)pTVar8,testCtx,(string *)&testParameters,&local_2a8);
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00c0bd60;
    Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)(pTVar8 + 1),
               (Texture2DMipmapTestCaseParameters *)&name);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,pTVar8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&testParameters);
    std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    ~_Vector_base(&local_188);
  }
  for (lVar7 = 0;
      pTVar3 = biasGroup2D.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar7 != 0x40; lVar7 = lVar7 + 0x10) {
    Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)&name);
    pcVar1 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar7);
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = 0;
    TStack_168.minFilterName = pcVar1;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    emplace_back<vkt::texture::util::Program>
              ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &local_188,(Program *)&testParameters);
    pTVar3 = maxLevelGroup2D.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar8 = (TestNode *)operator_new(0xc0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testParameters,pcVar1,(allocator<char> *)local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"",(allocator<char> *)&local_200);
    TestCase::TestCase((TestCase *)pTVar8,testCtx,(string *)&testParameters,&local_2a8);
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00c0be08;
    Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)(pTVar8 + 1),
               (Texture2DMipmapTestCaseParameters *)&name);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,pTVar8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&testParameters);
    std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    ~_Vector_base(&local_188);
  }
  biasGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
  pTVar3 = minLodGroup2D.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  minLodGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
  pTVar3 = maxLodGroup2D.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  maxLodGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
  pTVar3 = baseLevelGroup2D.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  baseLevelGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
  pTVar3 = maxLevelGroup2D.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  maxLevelGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
  pTVar3 = group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild(local_1b8,&pTVar3->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&maxLevelGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&baseLevelGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&maxLodGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&minLodGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&biasGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>)
  ;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"cubemap","Cube Mipmap Filtering");
  group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar3;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"min_lod","Lod control: min lod");
  biasGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar3;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"max_lod","Lod control: max lod");
  minLodGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = pTVar3;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"base_level","Base level");
  maxLodGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = pTVar3;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"max_level","Max level");
  paVar4 = (anon_struct_16_2_3f8b7511_conflict *)0x0;
  baseLevelGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar3;
  while (paVar4 != (anon_struct_16_2_3f8b7511_conflict *)0x3) {
    pTVar3 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar3,testCtx,populateTextureMipmappingTests::cubeCoordTypes[(long)paVar4].name,
               populateTextureMipmappingTests::cubeCoordTypes[(long)paVar4].desc);
    lVar7 = 0;
    maxLevelGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = pTVar3;
    local_1e0 = paVar4;
    while (paVar11 = local_1e0,
          pTVar3 = maxLevelGroup2D.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr, lVar7 != 4) {
      local_1c8 = populateTextureMipmappingTests::minFilterModes + lVar7;
      lVar9 = 0;
      local_1d8 = lVar7;
      while (lVar9 != 2) {
        local_288 = populateTextureMipmappingTests::magFilterModes + lVar9;
        local_1d0 = lVar9;
        for (lVar7 = 8; paVar11 = local_288, lVar7 != 0x38; lVar7 = lVar7 + 0x10) {
          TextureCubeMipmapTestCaseParameters::TextureCubeMipmapTestCaseParameters
                    ((TextureCubeMipmapTestCaseParameters *)&testParameters);
          testParameters.super_TextureMipmapCommonTestCaseParameters.coordType =
               populateTextureMipmappingTests::cubeCoordTypes[(long)paVar4].type;
          testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
          minFilter = local_1c8->mode;
          testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
          magFilter = paVar11->mode;
          pcVar1 = local_1c8->name;
          testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
          wrapT = *(WrapMode *)((long)&populateTextureMipmappingTests::wrapModes[0].name + lVar7);
          testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
          wrapS = testParameters.super_Texture2DTestCaseParameters.
                  super_TextureCommonTestCaseParameters.wrapT;
          testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
          format = VK_FORMAT_R8G8B8A8_UNORM;
          testParameters.super_Texture2DTestCaseParameters.width = 0x40;
          _name = VK_SAMPLE_COUNT_16_BIT;
          this = &testParameters.super_Texture2DTestCaseParameters.
                  super_TextureCommonTestCaseParameters.programs;
          testParameters.super_TextureMipmapCommonTestCaseParameters.minFilterName = pcVar1;
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          emplace_back<vkt::texture::util::Program>(this,(Program *)&name);
          _name = VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_4_BIT;
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          emplace_back<vkt::texture::util::Program>(this,(Program *)&name);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
          poVar5 = std::operator<<((ostream *)&name,pcVar1);
          poVar5 = std::operator<<(poVar5,"_");
          poVar5 = std::operator<<(poVar5,paVar11->name);
          poVar5 = std::operator<<(poVar5,"_");
          std::operator<<(poVar5,*(char **)((long)&PTR_typeinfo_00c0b988 + lVar7));
          pTVar3 = maxLevelGroup2D.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr;
          pTVar8 = (TestNode *)operator_new(0xc0);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a8,local_230[0],(allocator<char> *)&coordTypeGroup);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"",&local_321);
          TestCase::TestCase((TestCase *)pTVar8,testCtx,&local_2a8,&local_200);
          pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00c0beb0;
          TextureCubeMipmapTestCaseParameters::TextureCubeMipmapTestCaseParameters
                    ((TextureCubeMipmapTestCaseParameters *)(pTVar8 + 1),
                     (TextureCubeMipmapTestCaseParameters *)&testParameters);
          tcu::TestNode::addChild(&pTVar3->super_TestNode,pTVar8);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)local_230);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
          std::
          _Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          ~_Vector_base(&testParameters.super_Texture2DTestCaseParameters.
                         super_TextureCommonTestCaseParameters.programs.
                         super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                       );
        }
        lVar9 = local_1d0 + 1;
      }
      lVar7 = local_1d8 + 1;
    }
    maxLevelGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(group2D.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&maxLevelGroup2D.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    paVar4 = (anon_struct_16_2_3f8b7511_conflict *)((long)&paVar11->name + 1);
  }
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 0x10) {
    TextureCubeMipmapTestCaseParameters::TextureCubeMipmapTestCaseParameters
              ((TextureCubeMipmapTestCaseParameters *)&name);
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = VK_SAMPLE_COUNT_16_BIT;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    emplace_back<vkt::texture::util::Program>
              ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &local_188,(Program *)&testParameters);
    pTVar3 = biasGroup2D.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar8 = (TestNode *)operator_new(0xc0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testParameters,
               *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar7),
               (allocator<char> *)local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"",(allocator<char> *)&local_200);
    TestCase::TestCase((TestCase *)pTVar8,testCtx,(string *)&testParameters,&local_2a8);
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00c0bf50;
    TextureCubeMipmapTestCaseParameters::TextureCubeMipmapTestCaseParameters
              ((TextureCubeMipmapTestCaseParameters *)(pTVar8 + 1),
               (TextureCubeMipmapTestCaseParameters *)&name);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,pTVar8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&testParameters);
    std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    ~_Vector_base(&local_188);
  }
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 0x10) {
    TextureCubeMipmapTestCaseParameters::TextureCubeMipmapTestCaseParameters
              ((TextureCubeMipmapTestCaseParameters *)&name);
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = VK_SAMPLE_COUNT_16_BIT;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    emplace_back<vkt::texture::util::Program>
              ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &local_188,(Program *)&testParameters);
    pTVar3 = minLodGroup2D.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar8 = (TestNode *)operator_new(0xc0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testParameters,
               *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar7),
               (allocator<char> *)local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"",(allocator<char> *)&local_200);
    TestCase::TestCase((TestCase *)pTVar8,testCtx,(string *)&testParameters,&local_2a8);
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00c0c040;
    TextureCubeMipmapTestCaseParameters::TextureCubeMipmapTestCaseParameters
              ((TextureCubeMipmapTestCaseParameters *)(pTVar8 + 1),
               (TextureCubeMipmapTestCaseParameters *)&name);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,pTVar8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&testParameters);
    std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    ~_Vector_base(&local_188);
  }
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 0x10) {
    TextureCubeMipmapTestCaseParameters::TextureCubeMipmapTestCaseParameters
              ((TextureCubeMipmapTestCaseParameters *)&name);
    pcVar1 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar7);
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = VK_SAMPLE_COUNT_16_BIT;
    TStack_168.minFilterName = pcVar1;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    emplace_back<vkt::texture::util::Program>
              ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &local_188,(Program *)&testParameters);
    pTVar3 = maxLodGroup2D.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar8 = (TestNode *)operator_new(0xc0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testParameters,pcVar1,(allocator<char> *)local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"",(allocator<char> *)&local_200);
    TestCase::TestCase((TestCase *)pTVar8,testCtx,(string *)&testParameters,&local_2a8);
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00c0c0e8;
    TextureCubeMipmapTestCaseParameters::TextureCubeMipmapTestCaseParameters
              ((TextureCubeMipmapTestCaseParameters *)(pTVar8 + 1),
               (TextureCubeMipmapTestCaseParameters *)&name);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,pTVar8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&testParameters);
    std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    ~_Vector_base(&local_188);
  }
  for (lVar7 = 0;
      pTVar3 = biasGroup2D.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar7 != 0x40; lVar7 = lVar7 + 0x10) {
    TextureCubeMipmapTestCaseParameters::TextureCubeMipmapTestCaseParameters
              ((TextureCubeMipmapTestCaseParameters *)&name);
    pcVar1 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar7);
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = VK_SAMPLE_COUNT_16_BIT;
    TStack_168.minFilterName = pcVar1;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    emplace_back<vkt::texture::util::Program>
              ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &local_188,(Program *)&testParameters);
    pTVar3 = baseLevelGroup2D.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar8 = (TestNode *)operator_new(0xc0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testParameters,pcVar1,(allocator<char> *)local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"",(allocator<char> *)&local_200);
    TestCase::TestCase((TestCase *)pTVar8,testCtx,(string *)&testParameters,&local_2a8);
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00c0c190;
    TextureCubeMipmapTestCaseParameters::TextureCubeMipmapTestCaseParameters
              ((TextureCubeMipmapTestCaseParameters *)(pTVar8 + 1),
               (TextureCubeMipmapTestCaseParameters *)&name);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,pTVar8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&testParameters);
    std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    ~_Vector_base(&local_188);
  }
  biasGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
  pTVar3 = minLodGroup2D.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  minLodGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
  pTVar3 = maxLodGroup2D.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  maxLodGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
  pTVar3 = baseLevelGroup2D.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  baseLevelGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
  pTVar3 = group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild(local_1b8,&pTVar3->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&baseLevelGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&maxLodGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&minLodGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&biasGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>)
  ;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"3d","3D Mipmap Filtering");
  group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar3;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"bias","User-supplied bias value");
  biasGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar3;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"min_lod","Lod control: min lod");
  minLodGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = pTVar3;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"max_lod","Lod control: max lod");
  maxLodGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = pTVar3;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"base_level","Base level");
  baseLevelGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar3;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"max_level","Max level");
  maxLevelGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar3;
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    pTVar3 = (TestCaseGroup *)operator_new(0x70);
    local_1c0 = lVar7;
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar3,testCtx,populateTextureMipmappingTests::coordTypes[lVar7].name,
               populateTextureMipmappingTests::coordTypes[lVar7].desc);
    local_1ac = populateTextureMipmappingTests::coordTypes[lVar7].type;
    local_288 = (anon_struct_16_2_3f8b7511_conflict *)0x18;
    if (local_1ac == COORDTYPE_BASIC) {
      local_288 = (anon_struct_16_2_3f8b7511_conflict *)&DAT_00000030;
    }
    lVar7 = local_1c0;
    coordTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = pTVar3;
    for (lVar9 = 0;
        pTVar3 = coordTypeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, lVar9 != 4; lVar9 = lVar9 + 1) {
      local_1e0 = populateTextureMipmappingTests::minFilterModes + lVar9;
      local_1d8 = lVar9;
      for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
        Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
                  ((Texture3DMipmapTestCaseParameters *)&testParameters);
        testParameters.super_TextureMipmapCommonTestCaseParameters.minFilterName =
             (char *)CONCAT44(testParameters.super_TextureMipmapCommonTestCaseParameters.
                              minFilterName._4_4_,local_1ac);
        testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
        minFilter = local_1e0->mode;
        pcVar1 = local_1e0->name;
        testParameters.super_TextureMipmapCommonTestCaseParameters.coordType =
             populateTextureMipmappingTests::wrapModes[lVar12].mode;
        testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.wrapT
             = testParameters.super_TextureMipmapCommonTestCaseParameters.coordType;
        testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.wrapS
             = testParameters.super_TextureMipmapCommonTestCaseParameters.coordType;
        testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
        format = VK_FORMAT_R8G8B8A8_UNORM;
        _name = VK_SAMPLE_COUNT_32_BIT;
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        emplace_back<vkt::texture::util::Program>
                  (&testParameters.super_Texture2DTestCaseParameters.
                    super_TextureCommonTestCaseParameters.programs,(Program *)&name);
        local_1c8 = (anon_struct_16_2_3f8b7511_conflict *)
                    (populateTextureMipmappingTests::wrapModes + lVar12);
        local_1d0 = lVar12;
        for (paVar4 = (anon_struct_16_2_3f8b7511_conflict *)0x0; lVar12 = local_1d0,
            local_288 != paVar4; paVar4 = (anon_struct_16_2_3f8b7511_conflict *)&paVar4[1].mode) {
          testParameters.super_Texture2DTestCaseParameters.width = paVar4[0xc0baa].mode;
          testParameters.super_Texture2DTestCaseParameters.height =
               *(int *)&paVar4[0xc0baa].field_0xc;
          testParameters.super_TextureMipmapCommonTestCaseParameters._4_4_ =
               *(undefined4 *)&paVar4[0xc0bab].name;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
          poVar5 = std::operator<<((ostream *)&name,pcVar1);
          poVar5 = std::operator<<(poVar5,"_");
          std::operator<<(poVar5,local_1c8->name);
          pcVar2 = paVar4[0xc0baa].name;
          if (pcVar2 != (char *)0x0) {
            poVar5 = std::operator<<((ostream *)&name,"_");
            std::operator<<(poVar5,pcVar2);
          }
          pTVar3 = coordTypeGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.ptr;
          pTVar10 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance>
                     *)operator_new(200);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a8,local_230[0],&local_321);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"",&local_309);
          util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance>::
          TextureTestCase(pTVar10,testCtx,&local_2a8,&local_200,(ParameterType *)&testParameters);
          tcu::TestNode::addChild(&pTVar3->super_TestNode,(TestNode *)pTVar10);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)local_230);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
          lVar9 = local_1d8;
        }
        std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
        ::~_Vector_base(&testParameters.super_Texture2DTestCaseParameters.
                         super_TextureCommonTestCaseParameters.programs.
                         super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                       );
        lVar7 = local_1c0;
      }
    }
    coordTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(group2D.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&coordTypeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  }
  paVar4 = (anon_struct_16_2_3f8b7511_conflict *)0x0;
  while (paVar4 != (anon_struct_16_2_3f8b7511_conflict *)0x40) {
    Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)&name);
    TStack_168.minFilterName = (char *)CONCAT44(TStack_168.minFilterName._4_4_,1);
    local_170._0_4_ = 0x20;
    local_170._4_4_ = 0x20;
    TStack_168.coordType = COORDTYPE_AFFINE;
    TStack_168._4_4_ = 0x20;
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = VK_SAMPLE_COUNT_32_BIT;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    emplace_back<vkt::texture::util::Program>
              ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &local_188,(Program *)&testParameters);
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = VK_SAMPLE_COUNT_32_BIT|VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT;
    local_288 = paVar4;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    emplace_back<vkt::texture::util::Program>
              ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &local_188,(Program *)&testParameters);
    pTVar3 = biasGroup2D.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar10 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance> *)
              operator_new(200);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testParameters,local_288[0xc0b9c].name,(allocator<char> *)local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"",(allocator<char> *)&local_200);
    util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance>::
    TextureTestCase(pTVar10,testCtx,(string *)&testParameters,&local_2a8,(ParameterType *)&name);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,(TestNode *)pTVar10);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&testParameters);
    std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    ~_Vector_base(&local_188);
    paVar4 = local_288 + 1;
  }
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 0x10) {
    Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)&name);
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = VK_SAMPLE_COUNT_32_BIT;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    emplace_back<vkt::texture::util::Program>
              ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &local_188,(Program *)&testParameters);
    pTVar3 = minLodGroup2D.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar8 = (TestNode *)operator_new(200);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testParameters,
               *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar7),
               (allocator<char> *)local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"",(allocator<char> *)&local_200);
    TestCase::TestCase((TestCase *)pTVar8,testCtx,(string *)&testParameters,&local_2a8);
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00c0c2d8;
    Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)(pTVar8 + 1),
               (Texture3DMipmapTestCaseParameters *)&name);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,pTVar8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&testParameters);
    std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    ~_Vector_base(&local_188);
  }
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 0x10) {
    Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)&name);
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = VK_SAMPLE_COUNT_32_BIT;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    emplace_back<vkt::texture::util::Program>
              ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &local_188,(Program *)&testParameters);
    pTVar3 = maxLodGroup2D.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar8 = (TestNode *)operator_new(200);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testParameters,
               *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar7),
               (allocator<char> *)local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"",(allocator<char> *)&local_200);
    TestCase::TestCase((TestCase *)pTVar8,testCtx,(string *)&testParameters,&local_2a8);
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00c0c3c8;
    Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)(pTVar8 + 1),
               (Texture3DMipmapTestCaseParameters *)&name);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,pTVar8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&testParameters);
    std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    ~_Vector_base(&local_188);
  }
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 0x10) {
    Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)&name);
    pcVar1 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar7);
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = VK_SAMPLE_COUNT_32_BIT;
    local_158 = pcVar1;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    emplace_back<vkt::texture::util::Program>
              ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &local_188,(Program *)&testParameters);
    pTVar3 = baseLevelGroup2D.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar8 = (TestNode *)operator_new(200);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testParameters,pcVar1,(allocator<char> *)local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"",(allocator<char> *)&local_200);
    TestCase::TestCase((TestCase *)pTVar8,testCtx,(string *)&testParameters,&local_2a8);
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00c0c470;
    Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)(pTVar8 + 1),
               (Texture3DMipmapTestCaseParameters *)&name);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,pTVar8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&testParameters);
    std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    ~_Vector_base(&local_188);
  }
  for (lVar7 = 0;
      pTVar3 = biasGroup2D.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar7 != 0x40; lVar7 = lVar7 + 0x10) {
    Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)&name);
    pcVar1 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar7);
    testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = VK_SAMPLE_COUNT_32_BIT;
    local_158 = pcVar1;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    emplace_back<vkt::texture::util::Program>
              ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &local_188,(Program *)&testParameters);
    pTVar3 = maxLevelGroup2D.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pTVar8 = (TestNode *)operator_new(200);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testParameters,pcVar1,(allocator<char> *)local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"",(allocator<char> *)&local_200);
    TestCase::TestCase((TestCase *)pTVar8,testCtx,(string *)&testParameters,&local_2a8);
    pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00c0c518;
    Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)(pTVar8 + 1),
               (Texture3DMipmapTestCaseParameters *)&name);
    tcu::TestNode::addChild(&pTVar3->super_TestNode,pTVar8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&testParameters);
    std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    ~_Vector_base(&local_188);
  }
  biasGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
  pTVar3 = minLodGroup2D.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  minLodGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
  pTVar3 = maxLodGroup2D.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  maxLodGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
  .ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
  pTVar3 = baseLevelGroup2D.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  baseLevelGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
  pTVar3 = maxLevelGroup2D.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  maxLevelGroup2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data.ptr)->super_TestNode,&pTVar3->super_TestNode);
  pTVar3 = group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data.ptr;
  group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  tcu::TestNode::addChild(local_1b8,&pTVar3->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&maxLevelGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&baseLevelGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&maxLodGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&minLodGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&biasGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>)
  ;
  return;
}

Assistant:

void populateTextureMipmappingTests (tcu::TestCaseGroup* textureMipmappingTests)
{
	tcu::TestContext&	testCtx		= textureMipmappingTests->getTestContext();

	static const struct
	{
		const char*				name;
		const Sampler::WrapMode	mode;
	} wrapModes[] =
	{
		{ "clamp",		Sampler::CLAMP_TO_EDGE		},
		{ "repeat",		Sampler::REPEAT_GL			},
		{ "mirror",		Sampler::MIRRORED_REPEAT_GL	}
	};

	static const struct
	{
		const char*					name;
		const Sampler::FilterMode	mode;
	} minFilterModes[] =
	{
		{ "nearest_nearest",	Sampler::NEAREST_MIPMAP_NEAREST	},
		{ "linear_nearest",		Sampler::LINEAR_MIPMAP_NEAREST	},
		{ "nearest_linear",		Sampler::NEAREST_MIPMAP_LINEAR	},
		{ "linear_linear",		Sampler::LINEAR_MIPMAP_LINEAR	}
	};

	static const struct
	{
		const char*					name;
		const Sampler::FilterMode	mode;
	} magFilterModes[] =
	{
		{ "nearest",	Sampler::NEAREST},
		{ "linear",		Sampler::LINEAR}
	};


	static const struct
	{
		const CoordType		type;
		const char*			name;
		const char*			desc;
	} coordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_AFFINE,		"affine",		"Mipmapping with affine coordinate transform"		},
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	static const struct
	{
		const char*		name;
		const int		width;
		const int		height;
	} tex2DSizes[] =
	{
		{ DE_NULL,		64, 64 }, // Default.
		{ "npot",		63, 57 },
		{ "non_square",	32, 64 }
	};

	static const struct
	{
		const char*		name;
		const int		width;
		const int		height;
		const int		depth;
	} tex3DSizes[] =
	{
		{ DE_NULL,		32, 32, 32 }, // Default.
		{ "npot",		33, 29, 27 }
	};

	const int cubeMapSize = 64;

	static const struct
	{
		const CoordType		type;
		const char*			name;
		const char*			desc;
	} cubeCoordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			},
		{ COORDTYPE_BASIC_BIAS,	"bias",			"User-supplied bias value"							}
	};

	// 2D cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	group2D				(new tcu::TestCaseGroup(testCtx, "2d", "2D Mipmap Filtering"));

		de::MovePtr<tcu::TestCaseGroup>	biasGroup2D			(new tcu::TestCaseGroup(testCtx, "bias", "User-supplied bias value"));
		de::MovePtr<tcu::TestCaseGroup>	minLodGroup2D		(new tcu::TestCaseGroup(testCtx, "min_lod", "Lod control: min lod"));
		de::MovePtr<tcu::TestCaseGroup>	maxLodGroup2D		(new tcu::TestCaseGroup(testCtx, "max_lod", "Lod control: max lod"));
		de::MovePtr<tcu::TestCaseGroup>	baseLevelGroup2D	(new tcu::TestCaseGroup(testCtx, "base_level", "Base level"));
		de::MovePtr<tcu::TestCaseGroup>	maxLevelGroup2D		(new tcu::TestCaseGroup(testCtx, "max_level", "Max level"));

		for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
		{
			de::MovePtr<tcu::TestCaseGroup>	coordTypeGroup		(new tcu::TestCaseGroup(testCtx, coordTypes[coordType].name, coordTypes[coordType].desc));

			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
				{
					// Add non_square variants to basic cases only.
					int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex2DSizes) : 1;

					for (int size = 0; size < sizeEnd; size++)
					{
						Texture2DMipmapTestCaseParameters	testParameters;

						testParameters.coordType	= coordTypes[coordType].type;
						testParameters.minFilter	= minFilterModes[minFilter].mode;
						testParameters.wrapS		= wrapModes[wrapMode].mode;
						testParameters.wrapT		= wrapModes[wrapMode].mode;
						testParameters.format		= VK_FORMAT_R8G8B8A8_UNORM; //not sure (GL_RGBA)
						testParameters.width		= tex2DSizes[size].width;
						testParameters.height		= tex2DSizes[size].height;
						testParameters.programs.push_back(PROGRAM_2D_FLOAT);

						std::ostringstream name;
						name << minFilterModes[minFilter].name
							 << "_" << wrapModes[wrapMode].name;

						if (tex2DSizes[size].name)
							name << "_" << tex2DSizes[size].name;

						coordTypeGroup->addChild(new TextureTestCase<Texture2DMipmapTestInstance>(testCtx, name.str().c_str(), "", testParameters));
					}
				}
			}

			group2D->addChild(coordTypeGroup.release());
		}

		// 2D bias variants.
		{
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;

				testParameters.coordType	= COORDTYPE_BASIC_BIAS;
				testParameters.minFilter	= minFilterModes[minFilter].mode;
				testParameters.magFilter	= minFilterModes[minFilter].mode;
				testParameters.wrapS		= Sampler::REPEAT_GL;
				testParameters.wrapT		= Sampler::REPEAT_GL;
				testParameters.format		= VK_FORMAT_R8G8B8A8_UNORM; //not sure (GL_RGBA)
				testParameters.width		= tex2DSizes[0].width;
				testParameters.height		= tex2DSizes[0].height;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT_BIAS);

				std::ostringstream name;
				name << minFilterModes[minFilter].name;

				biasGroup2D->addChild(new TextureTestCase<Texture2DMipmapTestInstance>(testCtx, name.str().c_str(), "", testParameters));
			}
		}

		// 2D LOD controls.
		{
			// MIN_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter	= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT);

				minLodGroup2D->addChild(new TextureTestCase<Texture2DMinLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT);

				maxLodGroup2D->addChild(new TextureTestCase<Texture2DMaxLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		{
			// BASE_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.minFilterName = minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT);

				baseLevelGroup2D->addChild(new TextureTestCase<Texture2DBaseLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.minFilterName = minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT);

				maxLevelGroup2D->addChild(new TextureTestCase<Texture2DMaxLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		group2D->addChild(biasGroup2D.release());
		group2D->addChild(minLodGroup2D.release());
		group2D->addChild(maxLodGroup2D.release());
		group2D->addChild(baseLevelGroup2D.release());
		group2D->addChild(maxLevelGroup2D.release());

		textureMipmappingTests->addChild(group2D.release());
	}

	// Cubemap cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	groupCube			(new tcu::TestCaseGroup(testCtx, "cubemap", "Cube Mipmap Filtering"));

		de::MovePtr<tcu::TestCaseGroup>	minLodGroupCube		(new tcu::TestCaseGroup(testCtx, "min_lod", "Lod control: min lod"));
		de::MovePtr<tcu::TestCaseGroup>	maxLodGroupCube		(new tcu::TestCaseGroup(testCtx, "max_lod", "Lod control: max lod"));
		de::MovePtr<tcu::TestCaseGroup>	baseLevelGroupCube	(new tcu::TestCaseGroup(testCtx, "base_level", "Base level"));
		de::MovePtr<tcu::TestCaseGroup>	maxLevelGroupCube	(new tcu::TestCaseGroup(testCtx, "max_level", "Max level"));

		for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(cubeCoordTypes); coordType++)
		{
			de::MovePtr<tcu::TestCaseGroup>	coordTypeGroup	(new tcu::TestCaseGroup(testCtx, cubeCoordTypes[coordType].name, cubeCoordTypes[coordType].desc));

			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				for (int magFilter = 0; magFilter < DE_LENGTH_OF_ARRAY(magFilterModes); magFilter++)
				{
					for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
					{
						TextureCubeMipmapTestCaseParameters	testParameters;

						testParameters.coordType		= cubeCoordTypes[coordType].type;
						testParameters.minFilter		= minFilterModes[minFilter].mode;
						testParameters.magFilter		= magFilterModes[magFilter].mode;
						testParameters.minFilterName	= minFilterModes[minFilter].name;
						testParameters.wrapS			= wrapModes[wrapMode].mode;
						testParameters.wrapT			= wrapModes[wrapMode].mode;
						testParameters.format			= VK_FORMAT_R8G8B8A8_UNORM;
						testParameters.size				= cubeMapSize;
						testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);
						testParameters.programs.push_back(PROGRAM_CUBE_FLOAT_BIAS);

						std::ostringstream name;
						name << minFilterModes[minFilter].name
							 << "_" << magFilterModes[magFilter].name
							 << "_" << wrapModes[wrapMode].name;

						coordTypeGroup->addChild(new TextureTestCase<TextureCubeMipmapTestInstance>(testCtx, name.str().c_str(), "", testParameters));
					}
				}
			}

			groupCube->addChild(coordTypeGroup.release());
		}

		// Cubemap LOD controls.
		{
			// MIN_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				TextureCubeMipmapTestCaseParameters	testParameters;
				testParameters.minFilter	= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);

				minLodGroupCube->addChild(new TextureTestCase<TextureCubeMinLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				TextureCubeMipmapTestCaseParameters	testParameters;
				testParameters.minFilter	= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);

				maxLodGroupCube->addChild(new TextureTestCase<TextureCubeMaxLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		{
			// BASE_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				TextureCubeMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.minFilterName = minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);

				baseLevelGroupCube->addChild(new TextureTestCase<TextureCubeBaseLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				TextureCubeMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.minFilterName = minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);

				maxLevelGroupCube->addChild(new TextureTestCase<TextureCubeMaxLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		groupCube->addChild(minLodGroupCube.release());
		groupCube->addChild(maxLodGroupCube.release());
		groupCube->addChild(baseLevelGroupCube.release());
		groupCube->addChild(maxLevelGroupCube.release());

		textureMipmappingTests->addChild(groupCube.release());
	}

	// 3D cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	group3D				(new tcu::TestCaseGroup(testCtx, "3d", "3D Mipmap Filtering"));

		de::MovePtr<tcu::TestCaseGroup>	biasGroup3D			(new tcu::TestCaseGroup(testCtx, "bias", "User-supplied bias value"));
		de::MovePtr<tcu::TestCaseGroup>	minLodGroup3D		(new tcu::TestCaseGroup(testCtx, "min_lod", "Lod control: min lod"));
		de::MovePtr<tcu::TestCaseGroup>	maxLodGroup3D		(new tcu::TestCaseGroup(testCtx, "max_lod", "Lod control: max lod"));
		de::MovePtr<tcu::TestCaseGroup>	baseLevelGroup3D	(new tcu::TestCaseGroup(testCtx, "base_level", "Base level"));
		de::MovePtr<tcu::TestCaseGroup>	maxLevelGroup3D		(new tcu::TestCaseGroup(testCtx, "max_level", "Max level"));

		for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
		{
			de::MovePtr<tcu::TestCaseGroup>	coordTypeGroup	(new tcu::TestCaseGroup(testCtx, coordTypes[coordType].name, coordTypes[coordType].desc));

			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
				{
					// Add other size variants to basic cases only.
					int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex3DSizes) : 1;

					Texture3DMipmapTestCaseParameters	testParameters;

					testParameters.coordType		= coordTypes[coordType].type;
					testParameters.minFilter		= minFilterModes[minFilter].mode;
					testParameters.minFilterName	= minFilterModes[minFilter].name;
					testParameters.wrapR			= wrapModes[wrapMode].mode;
					testParameters.wrapS			= wrapModes[wrapMode].mode;
					testParameters.wrapT			= wrapModes[wrapMode].mode;
					testParameters.format			= VK_FORMAT_R8G8B8A8_UNORM;
					testParameters.programs.push_back(PROGRAM_3D_FLOAT);

					for (int size = 0; size < sizeEnd; size++)
					{
						testParameters.width			= tex3DSizes[size].width;
						testParameters.height			= tex3DSizes[size].height;
						testParameters.depth			= tex3DSizes[size].depth;

						std::ostringstream name;
						name << minFilterModes[minFilter].name
							 << "_" << wrapModes[wrapMode].name;

						if (tex3DSizes[size].name)
							name << "_" << tex3DSizes[size].name;

						coordTypeGroup->addChild(new TextureTestCase<Texture3DMipmapTestInstance>(testCtx, name.str().c_str(), "", testParameters));
					}
				}
			}

			group3D->addChild(coordTypeGroup.release());
		}

		// 3D bias variants.
		{
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.coordType			= COORDTYPE_BASIC_BIAS;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.wrapR				= Sampler::REPEAT_GL;
				testParameters.wrapS				= Sampler::REPEAT_GL;
				testParameters.wrapT				= Sampler::REPEAT_GL;
				testParameters.format				= VK_FORMAT_R8G8B8A8_UNORM;
				testParameters.width				= tex3DSizes[0].width;
				testParameters.height				= tex3DSizes[0].height;
				testParameters.depth				= tex3DSizes[0].depth;

				testParameters.programs.push_back(PROGRAM_3D_FLOAT);
				testParameters.programs.push_back(PROGRAM_3D_FLOAT_BIAS);

				biasGroup3D->addChild(new TextureTestCase<Texture3DMipmapTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		// 3D LOD controls.
		{
			// MIN_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_3D_FLOAT);

				minLodGroup3D->addChild(new TextureTestCase<Texture3DMinLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_3D_FLOAT);

				maxLodGroup3D->addChild(new TextureTestCase<Texture3DMaxLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		{
			// BASE_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.minFilterName		= minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_3D_FLOAT);

				baseLevelGroup3D->addChild(new TextureTestCase<Texture3DBaseLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.minFilterName		= minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_3D_FLOAT);

				maxLevelGroup3D->addChild(new TextureTestCase<Texture3DMaxLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		group3D->addChild(biasGroup3D.release());
		group3D->addChild(minLodGroup3D.release());
		group3D->addChild(maxLodGroup3D.release());
		group3D->addChild(baseLevelGroup3D.release());
		group3D->addChild(maxLevelGroup3D.release());

		textureMipmappingTests->addChild(group3D.release());
	}
}